

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  cJSON *pcVar1;
  
  if (case_sensitive != 0) {
    pcVar1 = cJSON_GetObjectItemCaseSensitive(object,name);
    return pcVar1;
  }
  pcVar1 = get_object_item(object,name,0);
  return pcVar1;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
        while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    return current_element;
}